

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBQuantize(uint8_t *dst_argb,int dst_stride_argb,int scale,int interval_size,
                int interval_offset,int dst_x,int dst_y,int width,int height)

{
  int iVar1;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  uint8_t *dst;
  _func_void_uint8_t_ptr_int_int_int_int *ARGBQuantizeRow;
  int y;
  long local_38;
  code *pcVar2;
  int local_28;
  int local_14;
  int local_4;
  
  pcVar2 = ARGBQuantizeRow_C;
  local_38 = in_RDI + (int)ARGBQuantizeRow * in_ESI + (long)(in_R9D << 2);
  if (((((in_RDI == 0) || (y < 1)) || (interval_offset < 1)) ||
      ((in_R9D < 0 || ((int)ARGBQuantizeRow < 0)))) || ((in_ECX < 1 || (0xff < in_ECX)))) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    if (in_ESI == y << 2) {
      y = interval_offset * y;
      interval_offset = 1;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && ((y & 3U) == 0)) {
      pcVar2 = ARGBQuantizeRow_SSE2;
    }
    for (local_28 = 0; local_28 < interval_offset; local_28 = local_28 + 1) {
      (*pcVar2)(local_38,in_EDX,in_ECX,in_R8D,y);
      local_38 = local_38 + local_14;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBQuantize(uint8_t* dst_argb,
                 int dst_stride_argb,
                 int scale,
                 int interval_size,
                 int interval_offset,
                 int dst_x,
                 int dst_y,
                 int width,
                 int height) {
  int y;
  void (*ARGBQuantizeRow)(uint8_t * dst_argb, int scale, int interval_size,
                          int interval_offset, int width) = ARGBQuantizeRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0 ||
      interval_size < 1 || interval_size > 255) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBQUANTIZEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 4)) {
    ARGBQuantizeRow = ARGBQuantizeRow_SSE2;
  }
#endif
#if defined(HAS_ARGBQUANTIZEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBQuantizeRow = ARGBQuantizeRow_NEON;
  }
#endif
#if defined(HAS_ARGBQUANTIZEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBQuantizeRow = ARGBQuantizeRow_MSA;
  }
#endif
  for (y = 0; y < height; ++y) {
    ARGBQuantizeRow(dst, scale, interval_size, interval_offset, width);
    dst += dst_stride_argb;
  }
  return 0;
}